

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::session_impl::close_connection(session_impl *this,peer_connection *p)

{
  iterator __position;
  shared_ptr<libtorrent::aux::peer_connection> sp;
  key_type local_20;
  
  ::std::__shared_ptr<libtorrent::aux::peer_connection,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libtorrent::aux::peer_connection,void>
            ((__shared_ptr<libtorrent::aux::peer_connection,(__gnu_cxx::_Lock_policy)2> *)&local_20,
             (__weak_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2> *)
             &p->super_enable_shared_from_this<libtorrent::aux::peer_connection>);
  __position = ::std::
               _Rb_tree<std::shared_ptr<libtorrent::aux::peer_connection>,_std::shared_ptr<libtorrent::aux::peer_connection>,_std::_Identity<std::shared_ptr<libtorrent::aux::peer_connection>_>,_std::less<std::shared_ptr<libtorrent::aux::peer_connection>_>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
               ::find(&(this->m_connections)._M_t,&local_20);
  if ((_Rb_tree_header *)__position._M_node !=
      &(this->m_connections)._M_t._M_impl.super__Rb_tree_header) {
    ::std::
    _Rb_tree<std::shared_ptr<libtorrent::aux::peer_connection>,std::shared_ptr<libtorrent::aux::peer_connection>,std::_Identity<std::shared_ptr<libtorrent::aux::peer_connection>>,std::less<std::shared_ptr<libtorrent::aux::peer_connection>>,std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>>>
    ::erase_abi_cxx11_((_Rb_tree<std::shared_ptr<libtorrent::aux::peer_connection>,std::shared_ptr<libtorrent::aux::peer_connection>,std::_Identity<std::shared_ptr<libtorrent::aux::peer_connection>>,std::less<std::shared_ptr<libtorrent::aux::peer_connection>>,std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>>>
                        *)&this->m_connections,(const_iterator)__position._M_node);
    if ((local_20.super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (2 < (local_20.
             super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count)) {
      ::std::
      vector<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
      ::push_back(&this->m_undead_peers,&local_20);
    }
  }
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_20.
              super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void session_impl::close_connection(peer_connection* p) noexcept
	{
		TORRENT_ASSERT(is_single_thread());
		std::shared_ptr<peer_connection> sp(p->self());

		TORRENT_ASSERT(p->is_disconnecting());

		auto const i = m_connections.find(sp);
		// make sure the next disk peer round-robin cursor stays valid
		if (i != m_connections.end())
		{
			m_connections.erase(i);

			TORRENT_ASSERT(std::find(m_undead_peers.begin()
				, m_undead_peers.end(), sp) == m_undead_peers.end());

			// someone else is holding a reference, it's important that
			// it's destructed from the network thread. Make sure the
			// last reference is held by the network thread.
			TORRENT_ASSERT_VAL(m_undead_peers.capacity() > m_undead_peers.size()
				, m_undead_peers.capacity());
			if (sp.use_count() > 2)
				m_undead_peers.push_back(sp);
		}
	}